

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O2

void __thiscall QWidgetResizeHandler::keyPressEvent(QWidgetResizeHandler *this,QKeyEvent *e)

{
  MousePosition MVar1;
  QWidget *this_00;
  MousePosition MVar2;
  uint uVar3;
  int extraout_var;
  int extraout_EDX;
  int extraout_var_00;
  int iVar4;
  MousePosition m;
  Representation RVar5;
  Representation RVar6;
  long in_FS_OFFSET;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)this[0x40] & 2) == 0) || (*(int *)(this + 0x30) == 9)) goto LAB_00433b28;
  uVar3 = QKeyEvent::modifiers();
  m = TopLeft;
  MVar2 = Right;
  if ((uVar3 >> 0x1a & 1) != 0) {
    MVar2 = m;
  }
  local_38 = (QPoint)QCursor::pos();
  iVar4 = *(int *)(e + 0x40);
  RVar5 = local_38.xp.m_i;
  RVar6 = local_38.yp.m_i;
  switch(iVar4) {
  case 0x1000012:
    local_38.yp.m_i = RVar6.m_i;
    local_38.xp.m_i = RVar5.m_i - MVar2;
    QGuiApplication::primaryScreen();
    iVar4 = QScreen::virtualGeometry();
    m = *(MousePosition *)(this + 0x30);
    if ((int)(RVar5.m_i - MVar2) <= iVar4) {
      if ((m | BottomRight) == BottomLeft) {
        *(MousePosition *)(this + 0x20) = *(int *)(this + 0x20) + MVar2;
        *(MousePosition *)(this + 0x28) = *(int *)(this + 0x28) + MVar2;
      }
      else {
        *(MousePosition *)(this + 0x20) = *(int *)(this + 0x20) - MVar2;
        *(MousePosition *)(this + 0x28) = *(int *)(this + 0x28) - MVar2;
      }
    }
    if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeHorizontalDirectionFixed == '\0')) {
      resizeHorizontalDirectionFixed = '\x01';
      if (m == BottomRight) {
LAB_00433cd9:
        m = BottomLeft;
LAB_00433d1d:
        *(MousePosition *)(this + 0x30) = m;
      }
      else if (m == TopRight) {
        m = TopLeft;
        goto LAB_00433d1d;
      }
LAB_00433d68:
      setMouseCursor(this,m);
      this_00 = *(QWidget **)(this + 0x10);
      QWidget::cursor((QWidget *)&stack0xffffffffffffffc0);
      QWidget::grabMouse(this_00,(QCursor *)&stack0xffffffffffffffc0);
      QCursor::~QCursor((QCursor *)&stack0xffffffffffffffc0);
    }
    break;
  case 0x1000013:
    local_38.yp.m_i = RVar6.m_i - MVar2;
    local_38.xp.m_i = RVar5.m_i;
    QGuiApplication::primaryScreen();
    QScreen::virtualGeometry();
    MVar1 = *(MousePosition *)(this + 0x30);
    if ((int)(RVar6.m_i - MVar2) <= extraout_var) {
      if ((MVar1 == TopRight) || (MVar1 == TopLeft)) {
        *(MousePosition *)(this + 0x24) = *(int *)(this + 0x24) + MVar2;
        *(MousePosition *)(this + 0x2c) = *(int *)(this + 0x2c) + MVar2;
      }
      else {
        *(MousePosition *)(this + 0x24) = *(int *)(this + 0x24) - MVar2;
        *(MousePosition *)(this + 0x2c) = *(int *)(this + 0x2c) - MVar2;
      }
    }
    if (((MVar1 != Center & (byte)this[0x40] >> 1) == 1) && (resizeVerticalDirectionFixed == '\0'))
    {
      resizeVerticalDirectionFixed = '\x01';
      if (MVar1 != BottomLeft) {
        m = MVar1;
        if (MVar1 != BottomRight) goto LAB_00433d68;
        m = TopRight;
      }
      *(MousePosition *)(this + 0x30) = m;
      goto LAB_00433d68;
    }
    break;
  case 0x1000014:
    local_38.yp.m_i = RVar6.m_i;
    local_38.xp.m_i = RVar5.m_i + MVar2;
    QGuiApplication::primaryScreen();
    QScreen::virtualGeometry();
    m = *(MousePosition *)(this + 0x30);
    if (extraout_EDX <= (int)(RVar5.m_i + MVar2)) {
      if ((m == TopRight) || (m == BottomRight)) {
        *(MousePosition *)(this + 0x20) = *(int *)(this + 0x20) + MVar2;
        *(MousePosition *)(this + 0x28) = *(int *)(this + 0x28) + MVar2;
      }
      else {
        *(MousePosition *)(this + 0x20) = *(int *)(this + 0x20) - MVar2;
        *(MousePosition *)(this + 0x28) = *(int *)(this + 0x28) - MVar2;
      }
    }
    if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeHorizontalDirectionFixed == '\0')) {
      resizeHorizontalDirectionFixed = '\x01';
      if (m == BottomLeft) {
LAB_00433d1b:
        m = BottomRight;
        goto LAB_00433d1d;
      }
      if (m == TopLeft) {
        m = TopRight;
        goto LAB_00433d1d;
      }
      goto LAB_00433d68;
    }
    break;
  case 0x1000015:
    local_38.yp.m_i = RVar6.m_i + MVar2;
    local_38.xp.m_i = RVar5.m_i;
    QGuiApplication::primaryScreen();
    QScreen::virtualGeometry();
    m = *(MousePosition *)(this + 0x30);
    if (extraout_var_00 <= (int)(RVar6.m_i + MVar2)) {
      if ((m & ~TopLeft) == BottomRight) {
        *(MousePosition *)(this + 0x24) = *(int *)(this + 0x24) + MVar2;
        iVar4 = MVar2 + *(int *)(this + 0x2c);
      }
      else {
        *(MousePosition *)(this + 0x24) = *(int *)(this + 0x24) - MVar2;
        iVar4 = *(int *)(this + 0x2c) - MVar2;
      }
      *(int *)(this + 0x2c) = iVar4;
    }
    if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeVerticalDirectionFixed == '\0')) {
      resizeVerticalDirectionFixed = '\x01';
      if (m == TopLeft) goto LAB_00433cd9;
      if (m == TopRight) goto LAB_00433d1b;
      goto LAB_00433d68;
    }
    break;
  default:
    if (((1 < iVar4 + 0xfefffffcU) && (iVar4 != 0x20)) && (iVar4 != 0x1000000)) goto LAB_00433b28;
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfd);
    QWidget::releaseMouse(*(QWidget **)(this + 0x10));
    QWidget::releaseKeyboard(*(QWidget **)(this + 0x10));
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
  }
  QCursor::setPos(&local_38);
LAB_00433b28:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::keyPressEvent(QKeyEvent * e)
{
    if (!isResizing())
        return;
    bool is_control = e->modifiers() & Qt::ControlModifier;
    int delta = is_control?1:8;
    QPoint pos = QCursor::pos();
    switch (e->key()) {
    case Qt::Key_Left:
        pos.rx() -= delta;
        if (pos.x() <= QGuiApplication::primaryScreen()->virtualGeometry().left()) {
            if (mode == TopLeft || mode == BottomLeft) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomRight)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = TopLeft;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Right:
        pos.rx() += delta;
        if (pos.x() >= QGuiApplication::primaryScreen()->virtualGeometry().right()) {
            if (mode == TopRight || mode == BottomRight) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = BottomRight;
            else if (mode == TopLeft)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Up:
        pos.ry() -= delta;
        if (pos.y() <= QGuiApplication::primaryScreen()->virtualGeometry().top()) {
            if (mode == TopLeft || mode == TopRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = TopLeft;
            else if (mode == BottomRight)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Down:
        pos.ry() += delta;
        if (pos.y() >= QGuiApplication::primaryScreen()->virtualGeometry().bottom()) {
            if (mode == BottomLeft || mode == BottomRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == TopLeft)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = BottomRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Space:
    case Qt::Key_Return:
    case Qt::Key_Enter:
    case Qt::Key_Escape:
        active = false;
        widget->releaseMouse();
        widget->releaseKeyboard();
        buttonDown = false;
        break;
    default:
        return;
    }
    QCursor::setPos(pos);
}